

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MultiAgentDecisionProcessDiscrete.cpp
# Opt level: O1

void __thiscall
MultiAgentDecisionProcessDiscrete::MultiAgentDecisionProcessDiscrete
          (MultiAgentDecisionProcessDiscrete *this,MultiAgentDecisionProcessDiscrete *a)

{
  size_t sVar1;
  undefined7 uVar2;
  bool bVar3;
  bool bVar4;
  undefined5 uVar5;
  int iVar6;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  
  *(undefined ***)&this->field_0x200 = &PTR__MultiAgentDecisionProcessDiscreteInterface_005d0b68;
  MultiAgentDecisionProcess::MultiAgentDecisionProcess
            (&this->super_MultiAgentDecisionProcess,&PTR_construction_vtable_64__005d08e0,
             &a->super_MultiAgentDecisionProcess);
  *(undefined8 *)&this->super_MultiAgentDecisionProcess = 0x5d0468;
  *(undefined8 *)&this->field_0x200 = 0x5d0760;
  MADPComponentDiscreteStates::MADPComponentDiscreteStates(&this->_m_S);
  MADPComponentDiscreteActions::MADPComponentDiscreteActions(&this->_m_A);
  MADPComponentDiscreteObservations::MADPComponentDiscreteObservations(&this->_m_O);
  uVar2 = *(undefined7 *)&(a->_m_S).field_0x9;
  sVar1 = (a->_m_S)._m_nrStates;
  (this->_m_S)._m_initialized = (a->_m_S)._m_initialized;
  *(undefined7 *)&(this->_m_S).field_0x9 = uVar2;
  (this->_m_S)._m_nrStates = sVar1;
  std::vector<StateDiscrete,_std::allocator<StateDiscrete>_>::operator=
            (&(this->_m_S)._m_stateVec,&(a->_m_S)._m_stateVec);
  (this->_m_S)._m_initialStateDistribution = (a->_m_S)._m_initialStateDistribution;
  bVar3 = (a->_m_A)._m_cachedAllJointActions;
  bVar4 = (a->_m_A)._m_jointIndicesValid;
  uVar5 = *(undefined5 *)&(a->_m_A).field_0xb;
  sVar1 = (a->_m_A)._m_nrJointActions;
  (this->_m_A)._m_initialized = (a->_m_A)._m_initialized;
  (this->_m_A)._m_cachedAllJointActions = bVar3;
  (this->_m_A)._m_jointIndicesValid = bVar4;
  *(undefined5 *)&(this->_m_A).field_0xb = uVar5;
  (this->_m_A)._m_nrJointActions = sVar1;
  (this->_m_A)._m_actionStepSize = (a->_m_A)._m_actionStepSize;
  std::vector<JointActionDiscrete_*,_std::allocator<JointActionDiscrete_*>_>::operator=
            (&(this->_m_A)._m_jointActionVec,&(a->_m_A)._m_jointActionVec);
  (this->_m_A)._m_jointActionIndices = (a->_m_A)._m_jointActionIndices;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator=
            (&(this->_m_A)._m_nrActions,&(a->_m_A)._m_nrActions);
  std::
  vector<std::vector<ActionDiscrete,_std::allocator<ActionDiscrete>_>,_std::allocator<std::vector<ActionDiscrete,_std::allocator<ActionDiscrete>_>_>_>
  ::operator=(&(this->_m_A)._m_actionVecs,&(a->_m_A)._m_actionVecs);
  (this->_m_O)._m_observationStepSize = (a->_m_O)._m_observationStepSize;
  bVar3 = (a->_m_O)._m_cachedAllJointObservations;
  bVar4 = (a->_m_O)._m_jointIndicesValid;
  uVar5 = *(undefined5 *)&(a->_m_O).field_0xb;
  sVar1 = (a->_m_O)._m_nrJointObservations;
  (this->_m_O)._m_initialized = (a->_m_O)._m_initialized;
  (this->_m_O)._m_cachedAllJointObservations = bVar3;
  (this->_m_O)._m_jointIndicesValid = bVar4;
  *(undefined5 *)&(this->_m_O).field_0xb = uVar5;
  (this->_m_O)._m_nrJointObservations = sVar1;
  std::vector<JointObservationDiscrete_*,_std::allocator<JointObservationDiscrete_*>_>::operator=
            (&(this->_m_O)._m_jointObservationVec,&(a->_m_O)._m_jointObservationVec);
  (this->_m_O)._m_jointObservationIndices = (a->_m_O)._m_jointObservationIndices;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator=
            (&(this->_m_O)._m_nrObservations,&(a->_m_O)._m_nrObservations);
  std::
  vector<std::vector<ObservationDiscrete,_std::allocator<ObservationDiscrete>_>,_std::allocator<std::vector<ObservationDiscrete,_std::allocator<ObservationDiscrete>_>_>_>
  ::operator=(&(this->_m_O)._m_observationVecs,&(a->_m_O)._m_observationVecs);
  this->_m_initialized = a->_m_initialized;
  this->_m_sparse = a->_m_sparse;
  this->_m_eventObservability = a->_m_eventObservability;
  iVar6 = (*(a->_m_p_tModel->super_TransitionModelDiscreteInterface).super_TransitionModel.
            _vptr_TransitionModel[2])();
  this->_m_p_tModel = (TransitionModelDiscrete *)CONCAT44(extraout_var,iVar6);
  iVar6 = (*(a->_m_p_oModel->super_ObservationModelDiscreteInterface).super_ObservationModel.
            _vptr_ObservationModel[2])();
  this->_m_p_oModel = (ObservationModelDiscrete *)CONCAT44(extraout_var_00,iVar6);
  this->_m_falseNegativeObs = a->_m_falseNegativeObs;
  return;
}

Assistant:

MultiAgentDecisionProcessDiscrete::MultiAgentDecisionProcessDiscrete(
    const MultiAgentDecisionProcessDiscrete& a) :
    MultiAgentDecisionProcessDiscreteInterface(a),
    MultiAgentDecisionProcess(a)
{
    _m_S=a._m_S;
    _m_A=a._m_A;
    _m_O=a._m_O;
    _m_initialized=a._m_initialized;
    _m_sparse=a._m_sparse;
    _m_eventObservability=a._m_eventObservability;
    _m_p_tModel=a._m_p_tModel->Clone();
    _m_p_oModel=a._m_p_oModel->Clone();
    _m_falseNegativeObs = a._m_falseNegativeObs;
}